

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetectorTest.cpp
# Opt level: O2

void __thiscall
TEST_MemoryLeakDetectorTest_TwoAllocOneFreeOneLeak_Test::testBody
          (TEST_MemoryLeakDetectorTest_TwoAllocOneFreeOneLeak_Test *this)

{
  int iVar1;
  bool bVar2;
  char *pcVar3;
  char *pcVar4;
  UtestShell *pUVar5;
  size_t sVar6;
  TestTerminator *pTVar7;
  SimpleString local_48;
  SimpleString output;
  
  pcVar3 = MemoryLeakDetector::allocMemory
                     ((this->super_TEST_GROUP_CppUTestGroupMemoryLeakDetectorTest).detector,
                      &((this->super_TEST_GROUP_CppUTestGroupMemoryLeakDetectorTest).testAllocator)
                       ->super_TestMemoryAllocator,4,false);
  pcVar4 = MemoryLeakDetector::allocMemory
                     ((this->super_TEST_GROUP_CppUTestGroupMemoryLeakDetectorTest).detector,
                      &((this->super_TEST_GROUP_CppUTestGroupMemoryLeakDetectorTest).testAllocator)
                       ->super_TestMemoryAllocator,0xc,false);
  MemoryLeakDetector::deallocMemory
            ((this->super_TEST_GROUP_CppUTestGroupMemoryLeakDetectorTest).detector,
             &((this->super_TEST_GROUP_CppUTestGroupMemoryLeakDetectorTest).testAllocator)->
              super_TestMemoryAllocator,pcVar3,false);
  MemoryLeakDetector::stopChecking
            ((this->super_TEST_GROUP_CppUTestGroupMemoryLeakDetectorTest).detector);
  pcVar3 = MemoryLeakDetector::report
                     ((this->super_TEST_GROUP_CppUTestGroupMemoryLeakDetectorTest).detector,
                      mem_leak_period_checking);
  SimpleString::SimpleString(&output,pcVar3);
  pUVar5 = UtestShell::getCurrent();
  sVar6 = MemoryLeakDetector::totalMemoryLeaks
                    ((this->super_TEST_GROUP_CppUTestGroupMemoryLeakDetectorTest).detector,
                     mem_leak_period_checking);
  pTVar7 = UtestShell::getCurrentTestTerminator();
  (*pUVar5->_vptr_UtestShell[0xe])
            (pUVar5,1,sVar6,
             "LONGS_EQUAL(1, detector->totalMemoryLeaks(mem_leak_period_checking)) failed",
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakDetectorTest.cpp"
             ,0xf5,pTVar7);
  pUVar5 = UtestShell::getCurrent();
  SimpleString::SimpleString(&local_48,"Leak size: 12");
  bVar2 = SimpleString::contains(&output,&local_48);
  pTVar7 = UtestShell::getCurrentTestTerminator();
  (*pUVar5->_vptr_UtestShell[8])
            (pUVar5,(ulong)bVar2,"CHECK","output.contains(\"Leak size: 12\")",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakDetectorTest.cpp"
             ,0xf6,pTVar7);
  SimpleString::~SimpleString(&local_48);
  pUVar5 = UtestShell::getCurrent();
  SimpleString::SimpleString(&local_48,"Leak size: 4");
  bVar2 = SimpleString::contains(&output,&local_48);
  pTVar7 = UtestShell::getCurrentTestTerminator();
  (*pUVar5->_vptr_UtestShell[8])
            (pUVar5,(ulong)!bVar2,"CHECK","!output.contains(\"Leak size: 4\")",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakDetectorTest.cpp"
             ,0xf7,pTVar7);
  SimpleString::~SimpleString(&local_48);
  (*PlatformSpecificFree)(pcVar4);
  pUVar5 = UtestShell::getCurrent();
  iVar1 = *(int *)&(((this->super_TEST_GROUP_CppUTestGroupMemoryLeakDetectorTest).testAllocator)->
                   super_TestMemoryAllocator).field_0x24;
  pTVar7 = UtestShell::getCurrentTestTerminator();
  (*pUVar5->_vptr_UtestShell[0xe])
            (pUVar5,2,(long)iVar1,"LONGS_EQUAL(2, testAllocator->alloc_called) failed",
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakDetectorTest.cpp"
             ,0xf9,pTVar7);
  pUVar5 = UtestShell::getCurrent();
  iVar1 = ((this->super_TEST_GROUP_CppUTestGroupMemoryLeakDetectorTest).testAllocator)->free_called;
  pTVar7 = UtestShell::getCurrentTestTerminator();
  (*pUVar5->_vptr_UtestShell[0xe])
            (pUVar5,1,(long)iVar1,"LONGS_EQUAL(1, testAllocator->free_called) failed",
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakDetectorTest.cpp"
             ,0xfa,pTVar7);
  SimpleString::~SimpleString(&output);
  return;
}

Assistant:

TEST(MemoryLeakDetectorTest, TwoAllocOneFreeOneLeak)
{
    char* mem = detector->allocMemory(testAllocator, 4);
    char* mem2 = detector->allocMemory(testAllocator, 12);
    detector->deallocMemory(testAllocator, mem);
    detector->stopChecking();
    SimpleString output = detector->report(mem_leak_period_checking);
    LONGS_EQUAL(1, detector->totalMemoryLeaks(mem_leak_period_checking));
    CHECK(output.contains("Leak size: 12"));
    CHECK(!output.contains("Leak size: 4"));
    PlatformSpecificFree(mem2);
    LONGS_EQUAL(2, testAllocator->alloc_called);
    LONGS_EQUAL(1, testAllocator->free_called);
}